

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chartype.c
# Opt level: O1

char * ct_encode_string(wchar_t *s,ct_buffer_t *conv)

{
  ulong uVar1;
  char *pcVar2;
  ssize_t sVar3;
  long lVar4;
  
  if (s == (wchar_t *)0x0) {
    return (char *)0x0;
  }
  pcVar2 = conv->cbuff;
  while( true ) {
    uVar1 = conv->csize;
    lVar4 = (long)pcVar2 - (long)conv->cbuff;
    if (uVar1 - lVar4 < 5) {
      if (uVar1 < 0xfffffffffffffc00) {
        conv->csize = uVar1 + 0x400;
        pcVar2 = (char *)realloc(conv->cbuff,uVar1 + 0x400);
        if (pcVar2 == (char *)0x0) {
          conv->csize = 0;
          free(conv->cbuff);
          conv->cbuff = (char *)0x0;
          return (char *)0x0;
        }
        conv->cbuff = pcVar2;
      }
      pcVar2 = conv->cbuff + lVar4;
    }
    if (*s == L'\0') break;
    sVar3 = ct_encode_char(pcVar2,5,*s);
    if (sVar3 == -1) {
      abort();
    }
    s = s + 1;
    pcVar2 = pcVar2 + sVar3;
  }
  *pcVar2 = '\0';
  return conv->cbuff;
}

Assistant:

char *
ct_encode_string(const wchar_t *s, ct_buffer_t *conv)
{
	char *dst;
	ssize_t used;

	if (!s)
		return NULL;

	dst = conv->cbuff;
	for (;;) {
		used = (ssize_t)(dst - conv->cbuff);
		if ((conv->csize - (size_t)used) < 5) {
			if (ct_conv_cbuff_resize(conv,
			    conv->csize + CT_BUFSIZ) == -1)
				return NULL;
			dst = conv->cbuff + used;
		}
		if (!*s)
			break;
		used = ct_encode_char(dst, (size_t)5, *s);
		if (used == -1) /* failed to encode, need more buffer space */
			abort();
		++s;
		dst += used;
	}
	*dst = '\0';
	return conv->cbuff;
}